

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_basic.cpp
# Opt level: O0

int __thiscall mpt::metatype::basic::convert(basic *this,type_t type,void *ptr)

{
  int local_3c;
  int me;
  void *ptr_local;
  type_t type_local;
  basic *this_local;
  
  if (type == 0) {
    metatype::convert(&this->super_metatype,0,ptr);
    this_local._4_4_ = _mpt_geninfo_conv(this + 1,0);
  }
  else {
    local_3c = type_properties<mpt::metatype::basic_*>::id(true);
    if (type == 0x100) {
      if (ptr != (void *)0x0) {
        *(basic **)ptr = this;
      }
      if (local_3c < 1) {
        local_3c = 0x100;
      }
      this_local._4_4_ = local_3c;
    }
    else if ((local_3c < 1) || (type != (long)local_3c)) {
      this_local._4_4_ = _mpt_geninfo_conv(this + 1,type,ptr);
    }
    else {
      if (ptr != (void *)0x0) {
        *(basic **)ptr = this;
      }
      this_local._4_4_ = 0x100;
    }
  }
  return this_local._4_4_;
}

Assistant:

int metatype::basic::convert(type_t type, void *ptr)
{
	if (!type) {
		metatype::convert(type, ptr);
		return _mpt_geninfo_conv(this + 1, 0, 0);
	}
	int me = mpt::type_properties<basic *>::id(true);
	if (type == TypeMetaPtr) {
		if (ptr) {
			*static_cast<metatype **>(ptr) = this;
		}
		return me > 0 ? me : static_cast<int>(TypeMetaPtr);
	}
	if (me > 0 && type == static_cast<type_t>(me)) {
		if (ptr) {
			*static_cast<basic **>(ptr) = this;
		}
		return static_cast<int>(TypeMetaPtr);
	}
	return _mpt_geninfo_conv(this + 1, type, ptr);
}